

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3rbu_destroy_vfs(char *zName)

{
  sqlite3_vfs *pVfs_00;
  sqlite3_vfs *pVfs;
  char *zName_local;
  
  pVfs_00 = sqlite3_vfs_find(zName);
  if ((pVfs_00 != (sqlite3_vfs *)0x0) && (pVfs_00->xOpen == rbuVfsOpen)) {
    sqlite3_mutex_free(*(sqlite3_mutex **)&pVfs_00[1].mxPathname);
    sqlite3_vfs_unregister(pVfs_00);
    sqlite3_free(pVfs_00);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3rbu_destroy_vfs(const char *zName){
  sqlite3_vfs *pVfs = sqlite3_vfs_find(zName);
  if( pVfs && pVfs->xOpen==rbuVfsOpen ){
    sqlite3_mutex_free(((rbu_vfs*)pVfs)->mutex);
    sqlite3_vfs_unregister(pVfs);
    sqlite3_free(pVfs);
  }
}